

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Data_Query_PDU::~Data_Query_PDU(Data_Query_PDU *this)

{
  Data_Query_PDU *this_local;
  
  ~Data_Query_PDU(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

Data_Query_PDU::~Data_Query_PDU()
{
}